

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O3

void __thiscall Image::Blit(Image *this,Image *src,int x,int y)

{
  pointer pcVar1;
  pointer pcVar2;
  color_t cVar3;
  int iVar4;
  int y_00;
  int iVar5;
  
  iVar5 = src->height_;
  if (0 < iVar5) {
    iVar4 = src->width_;
    y_00 = 0;
    do {
      if (0 < iVar4) {
        iVar5 = 0;
        do {
          cVar3 = Get(src,iVar5,y_00);
          iVar4 = this->width_ * y + x + iVar5;
          pcVar2 = (this->pixels_).super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar1 = pcVar2 + iVar4;
          pcVar1->r = (char)cVar3._0_2_;
          pcVar1->g = (char)((ushort)cVar3._0_2_ >> 8);
          pcVar2[iVar4].b = cVar3.b;
          iVar5 = iVar5 + 1;
          iVar4 = src->width_;
        } while (iVar5 < iVar4);
        iVar5 = src->height_;
      }
      y_00 = y_00 + 1;
      y = y + 1;
    } while (y_00 < iVar5);
  }
  return;
}

Assistant:

void Image::Blit(Image const& src, int x, int y) {
  for (auto yy = 0; yy < src.GetHeight(); ++yy) {
    for (auto xx = 0; xx < src.GetWidth(); ++xx) {
      Set(xx + x, yy + y, src.Get(xx, yy));
    }
  }
}